

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_compression_type.cpp
# Opt level: O0

FileCompressionType duckdb::FileCompressionTypeFromString(string *input)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  string *in_RDI;
  string parameter;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string local_88 [32];
  string *in_stack_ffffffffffffff98;
  string local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  string local_30 [32];
  string *local_10;
  FileCompressionType local_1;
  
  local_10 = in_RDI;
  StringUtil::Lower(in_stack_ffffffffffffff98);
  bVar1 = ::std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (!bVar1) {
    bVar1 = ::std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (!bVar1) {
      bVar1 = ::std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      if (bVar1) {
        local_1 = GZIP;
      }
      else {
        bVar1 = ::std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        if (bVar1) {
          local_1 = ZSTD;
        }
        else {
          bVar1 = ::std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          if (!bVar1) {
            bVar1 = ::std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
            if (!bVar1) {
              uVar2 = ::std::__cxx11::string::empty();
              if ((uVar2 & 1) == 0) {
                uVar3 = __cxa_allocate_exception(0x10);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_60,"Unrecognized file compression type \"%s\"",
                           (allocator *)&stack0xffffffffffffff9f);
                ::std::__cxx11::string::string(local_88,local_10);
                ParserException::ParserException<std::__cxx11::string>
                          ((ParserException *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
                __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
              }
            }
          }
          local_1 = UNCOMPRESSED;
        }
      }
      goto LAB_002ec87c;
    }
  }
  local_1 = AUTO_DETECT;
LAB_002ec87c:
  ::std::__cxx11::string::~string(local_30);
  return local_1;
}

Assistant:

FileCompressionType FileCompressionTypeFromString(const string &input) {
	auto parameter = StringUtil::Lower(input);
	if (parameter == "infer" || parameter == "auto") {
		return FileCompressionType::AUTO_DETECT;
	} else if (parameter == "gzip") {
		return FileCompressionType::GZIP;
	} else if (parameter == "zstd") {
		return FileCompressionType::ZSTD;
	} else if (parameter == "uncompressed" || parameter == "none" || parameter.empty()) {
		return FileCompressionType::UNCOMPRESSED;
	} else {
		throw ParserException("Unrecognized file compression type \"%s\"", input);
	}
}